

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O2

void dradb3(int ido,int l1,float *cc,float *ch,float *wa1,float *wa2)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  float *pfVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  iVar2 = l1 * ido;
  iVar8 = iVar2 * 2;
  iVar6 = ido * 2;
  iVar1 = ido * 3;
  lVar10 = (long)ido;
  iVar4 = 0;
  if (0 < l1) {
    iVar4 = l1;
  }
  pfVar3 = ch;
  pfVar12 = cc;
  iVar5 = iVar4;
  while (bVar13 = iVar5 != 0, iVar5 = iVar5 + -1, bVar13) {
    fVar14 = pfVar12[(long)iVar6 + -1] + pfVar12[(long)iVar6 + -1];
    fVar15 = fVar14 * -0.5 + *pfVar12;
    *pfVar3 = fVar14 + *pfVar12;
    fVar14 = (pfVar12[iVar6] + pfVar12[iVar6]) * 0.8660254;
    pfVar3[iVar2] = fVar15 - fVar14;
    pfVar3[iVar8] = fVar14 + fVar15;
    pfVar3 = pfVar3 + lVar10;
    pfVar12 = pfVar12 + iVar1;
  }
  if (ido != 1) {
    iVar11 = 0;
    pfVar3 = ch;
    for (iVar5 = 0; iVar5 != iVar4; iVar5 = iVar5 + 1) {
      lVar9 = -2;
      for (lVar7 = 2; lVar7 < lVar10; lVar7 = lVar7 + 2) {
        fVar16 = (cc[(long)iVar6 + lVar7 + -1] + cc[(long)iVar6 + lVar9 + -1]) * -0.5 +
                 cc[(long)iVar11 + lVar7 + -1];
        pfVar3[lVar7 + -1] =
             cc[(long)iVar6 + lVar7 + -1] + cc[(long)iVar6 + lVar9 + -1] +
             cc[(long)iVar11 + lVar7 + -1];
        fVar14 = (cc[iVar6 + lVar7] - cc[iVar6 + lVar9]) * -0.5 + cc[iVar11 + lVar7];
        pfVar3[lVar7] = (cc[iVar6 + lVar7] - cc[iVar6 + lVar9]) + cc[iVar11 + lVar7];
        fVar17 = (cc[(long)iVar6 + lVar7 + -1] - cc[(long)iVar6 + lVar9 + -1]) * 0.8660254;
        fVar15 = (cc[iVar6 + lVar7] + cc[iVar6 + lVar9]) * 0.8660254;
        fVar18 = fVar16 - fVar15;
        fVar15 = fVar15 + fVar16;
        fVar16 = fVar14 + fVar17;
        fVar14 = fVar14 - fVar17;
        ch[(long)iVar2 + lVar7 + -1] = wa1[lVar7 + -2] * fVar18 - wa1[lVar7 + -1] * fVar16;
        ch[iVar2 + lVar7] = fVar16 * wa1[lVar7 + -2] + fVar18 * wa1[lVar7 + -1];
        ch[(long)iVar8 + lVar7 + -1] = wa2[lVar7 + -2] * fVar15 - wa2[lVar7 + -1] * fVar14;
        ch[iVar8 + lVar7] = fVar14 * wa2[lVar7 + -2] + fVar15 * wa2[lVar7 + -1];
        lVar9 = lVar9 + -2;
      }
      iVar2 = iVar2 + ido;
      iVar8 = iVar8 + ido;
      iVar11 = iVar11 + iVar1;
      iVar6 = iVar6 + iVar1;
      pfVar3 = pfVar3 + lVar10;
    }
  }
  return;
}

Assistant:

static void dradb3(int ido,int l1,float *cc,float *ch,float *wa1,
                          float *wa2){
  static float taur = -.5f;
  static float taui = .8660254037844386f;
  int i,k,t0,t1,t2,t3,t4,t5,t6,t7,t8,t9,t10;
  float ci2,ci3,di2,di3,cr2,cr3,dr2,dr3,ti2,tr2;
  t0=l1*ido;

  t1=0;
  t2=t0<<1;
  t3=ido<<1;
  t4=ido+(ido<<1);
  t5=0;
  for(k=0;k<l1;k++){
    tr2=cc[t3-1]+cc[t3-1];
    cr2=cc[t5]+(taur*tr2);
    ch[t1]=cc[t5]+tr2;
    ci3=taui*(cc[t3]+cc[t3]);
    ch[t1+t0]=cr2-ci3;
    ch[t1+t2]=cr2+ci3;
    t1+=ido;
    t3+=t4;
    t5+=t4;
  }

  if(ido==1)return;

  t1=0;
  t3=ido<<1;
  for(k=0;k<l1;k++){
    t7=t1+(t1<<1);
    t6=(t5=t7+t3);
    t8=t1;
    t10=(t9=t1+t0)+t0;

    for(i=2;i<ido;i+=2){
      t5+=2;
      t6-=2;
      t7+=2;
      t8+=2;
      t9+=2;
      t10+=2;
      tr2=cc[t5-1]+cc[t6-1];
      cr2=cc[t7-1]+(taur*tr2);
      ch[t8-1]=cc[t7-1]+tr2;
      ti2=cc[t5]-cc[t6];
      ci2=cc[t7]+(taur*ti2);
      ch[t8]=cc[t7]+ti2;
      cr3=taui*(cc[t5-1]-cc[t6-1]);
      ci3=taui*(cc[t5]+cc[t6]);
      dr2=cr2-ci3;
      dr3=cr2+ci3;
      di2=ci2+cr3;
      di3=ci2-cr3;
      ch[t9-1]=wa1[i-2]*dr2-wa1[i-1]*di2;
      ch[t9]=wa1[i-2]*di2+wa1[i-1]*dr2;
      ch[t10-1]=wa2[i-2]*dr3-wa2[i-1]*di3;
      ch[t10]=wa2[i-2]*di3+wa2[i-1]*dr3;
    }
    t1+=ido;
  }
}